

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod.c
# Opt level: O2

int32 acmod_flags2list(acmod_t *acmod)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  uint *puVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  
  iVar7 = acmod->mdef->n_sen;
  if (acmod->compallsen == '\0') {
    uVar4 = (long)iVar7 / 0x20;
    uVar1 = (long)iVar7 % 0x20;
    puVar8 = acmod->senone_active_vec;
    uVar5 = 0;
    uVar2 = uVar4 & 0xffffffff;
    if ((int)uVar4 < 1) {
      uVar2 = uVar5;
    }
    iVar7 = 0;
    uVar9 = 0;
    for (; uVar5 != uVar2; uVar5 = uVar5 + 1) {
      if (*puVar8 != 0) {
        for (lVar3 = 0; lVar3 != 0x20; lVar3 = lVar3 + 1) {
          if ((*puVar8 & (uint)(1L << ((byte)lVar3 & 0x3f))) != 0) {
            uVar6 = (uint)lVar3 | (uint)(uVar5 << 5);
            lVar11 = (long)iVar7;
            lVar10 = lVar11 << 0x20;
            for (iVar12 = uVar6 - uVar9; iVar7 = iVar7 + 1, 0xff < iVar12; iVar12 = iVar12 + -0xff)
            {
              acmod->senone_active[lVar11] = 0xff;
              lVar11 = lVar11 + 1;
              lVar10 = lVar10 + 0x100000000;
            }
            acmod->senone_active[lVar10 >> 0x20] = (uint8)iVar12;
            uVar9 = uVar6;
          }
        }
      }
      puVar8 = puVar8 + 1;
    }
    uVar5 = 0;
    uVar4 = uVar1 & 0xffffffff;
    if ((int)uVar1 < 1) {
      uVar4 = uVar5;
    }
    for (; uVar5 != uVar4; uVar5 = uVar5 + 1) {
      if ((*puVar8 & (uint)(1L << ((byte)uVar5 & 0x3f))) != 0) {
        uVar6 = (int)uVar2 * 0x20 + (int)uVar5;
        lVar10 = (long)iVar7;
        lVar3 = lVar10 << 0x20;
        for (iVar12 = uVar6 - uVar9; iVar7 = iVar7 + 1, 0xff < iVar12; iVar12 = iVar12 + -0xff) {
          acmod->senone_active[lVar10] = 0xff;
          lVar10 = lVar10 + 1;
          lVar3 = lVar3 + 0x100000000;
        }
        acmod->senone_active[lVar3 >> 0x20] = (uint8)iVar12;
        uVar9 = uVar6;
      }
    }
  }
  acmod->n_senone_active = iVar7;
  return iVar7;
}

Assistant:

int32
acmod_flags2list(acmod_t *acmod)
{
    int32 w, l, n, b, total_dists, total_words, extra_bits;
    bitvec_t *flagptr;

    total_dists = bin_mdef_n_sen(acmod->mdef);
    if (acmod->compallsen) {
        acmod->n_senone_active = total_dists;
        return total_dists;
    }
    total_words = total_dists / BITVEC_BITS;
    extra_bits = total_dists % BITVEC_BITS;
    w = n = l = 0;
    for (flagptr = acmod->senone_active_vec; w < total_words; ++w, ++flagptr) {
        if (*flagptr == 0)
            continue;
        for (b = 0; b < BITVEC_BITS; ++b) {
            if (*flagptr & (1UL << b)) {
                int32 sen = w * BITVEC_BITS + b;
                int32 delta = sen - l;
                /* Handle excessive deltas "lossily" by adding a few
                   extra senones to bridge the gap. */
                while (delta > 255) {
                    acmod->senone_active[n++] = 255;
                    delta -= 255;
                }
                acmod->senone_active[n++] = delta;
                l = sen;
            }
        }
    }

    for (b = 0; b < extra_bits; ++b) {
        if (*flagptr & (1UL << b)) {
            int32 sen = w * BITVEC_BITS + b;
            int32 delta = sen - l;
            /* Handle excessive deltas "lossily" by adding a few
               extra senones to bridge the gap. */
            while (delta > 255) {
                acmod->senone_active[n++] = 255;
                delta -= 255;
            }
            acmod->senone_active[n++] = delta;
            l = sen;
        }
    }

    acmod->n_senone_active = n;
    E_DEBUG("acmod_flags2list: %d active in frame %d\n",
            acmod->n_senone_active, acmod->output_frame);
    return n;
}